

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

String * __thiscall Path::name(String *__return_storage_ptr__,Path *this)

{
  size_type sVar1;
  long lVar2;
  
  sVar1 = (this->super_String).mString._M_string_length;
  if ((sVar1 == 0) || ((this->super_String).mString._M_dataplus._M_p[sVar1 - 1] != '/')) {
    if ((int)sVar1 < 2) {
      lVar2 = 0;
    }
    else {
      lVar2 = std::__cxx11::string::rfind((char)this,0x2f);
      lVar2 = lVar2 + 1;
    }
    String::String(__return_storage_ptr__,(this->super_String).mString._M_dataplus._M_p + lVar2,
                   0xffffffffffffffff);
  }
  else {
    lVar2 = std::__cxx11::string::rfind((char)this,0x2f);
    if (lVar2 == -1) {
      (__return_storage_ptr__->mString)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->mString).field_2;
      (__return_storage_ptr__->mString)._M_string_length = 0;
      (__return_storage_ptr__->mString).field_2._M_local_buf[0] = '\0';
    }
    else {
      String::mid(__return_storage_ptr__,&this->super_String,lVar2 + 1,
                  ((this->super_String).mString._M_string_length - lVar2) - 2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String Path::name() const
{
    if (endsWith('/')) {
        const size_t secondLastSlash = lastIndexOf('/', size() - 2);
        if (secondLastSlash != String::npos) {
            return mid(secondLastSlash + 1, size() - secondLastSlash - 2);
        }
        return String();
    } else {
        return fileName();
    }
}